

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFEFStreamObjectHelper::setParam
          (QPDFEFStreamObjectHelper *this,string *pkey,QPDFObjectHandle *pval)

{
  bool bVar1;
  BaseHandle *pBVar2;
  QPDFObjectHandle params;
  allocator<char> local_91;
  undefined1 local_90 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  QPDFObjectHandle local_40 [2];
  
  pBVar2 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_90,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_90 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"/Params",(allocator<char> *)&local_50);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_70,(string *)(local_90 + 0x10));
  std::__cxx11::string::~string((string *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_70);
  if (!bVar1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"/Params",&local_91);
    QPDFObjectHandle::newDictionary();
    QPDFObjectHandle::replaceKeyAndGetNew
              ((QPDFObjectHandle *)(local_90 + 0x10),(string *)local_90,local_40);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    std::__cxx11::string::~string((string *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_70,pkey,pval);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  return;
}

Assistant:

void
QPDFEFStreamObjectHelper::setParam(std::string const& pkey, QPDFObjectHandle const& pval)
{
    auto params = oh().getDict().getKey("/Params");
    if (!params.isDictionary()) {
        params = oh().getDict().replaceKeyAndGetNew("/Params", QPDFObjectHandle::newDictionary());
    }
    params.replaceKey(pkey, pval);
}